

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitArrayGet
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,ArrayGet *curr)

{
  bool bVar1;
  uint uVar2;
  ExpressionRunner<wasm::ModuleRunner> *pEVar3;
  Literal *pLVar4;
  element_type *peVar5;
  size_t sVar6;
  Literal local_130;
  Literal local_118;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  Field field;
  undefined1 local_d0 [4];
  Index i;
  shared_ptr<wasm::GCData> data;
  Flow index;
  undefined1 local_68 [8];
  Flow ref;
  ArrayGet *curr_local;
  ExpressionRunner<wasm::ModuleRunner> *this_local;
  
  ref.breakTo.super_IString.str._M_str = (char *)curr;
  pEVar3 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
  visit((Flow *)local_68,pEVar3,*(Expression **)(ref.breakTo.super_IString.str._M_str + 0x10));
  bVar1 = Flow::breaking((Flow *)local_68);
  if (bVar1) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
  }
  else {
    pEVar3 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
    visit((Flow *)&data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
          pEVar3,*(Expression **)(ref.breakTo.super_IString.str._M_str + 0x18));
    bVar1 = Flow::breaking((Flow *)&data.
                                    super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount);
    if (bVar1) {
      Flow::Flow(__return_storage_ptr__,
                 (Flow *)&data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
    }
    else {
      Flow::getSingleValue((Flow *)local_68);
      ::wasm::Literal::getGCData();
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_d0);
      if (!bVar1) {
        (*this->_vptr_ExpressionRunner[2])(this,"null ref");
      }
      pLVar4 = Flow::getSingleValue
                         ((Flow *)&data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount);
      uVar2 = wasm::Literal::geti32(pLVar4);
      peVar5 = std::__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_d0);
      sVar6 = SmallVector<wasm::Literal,_1UL>::size
                        (&(peVar5->values).super_SmallVector<wasm::Literal,_1UL>);
      if (sVar6 <= uVar2) {
        (*this->_vptr_ExpressionRunner[2])(this,"array oob");
      }
      local_100 = ::wasm::Type::getHeapType();
      ::wasm::HeapType::getArray();
      uStack_e8 = local_f8;
      _field = uStack_f0;
      peVar5 = std::__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_d0);
      pLVar4 = SmallVector<wasm::Literal,_1UL>::operator[]
                         (&(peVar5->values).super_SmallVector<wasm::Literal,_1UL>,(ulong)uVar2);
      ::wasm::Literal::Literal(&local_130,pLVar4);
      extendForPacking(&local_118,this,&local_130,(Field *)&uStack_e8,
                       (bool)(ref.breakTo.super_IString.str._M_str[0x20] & 1));
      Flow::Flow(__return_storage_ptr__,&local_118);
      ::wasm::Literal::~Literal(&local_118);
      ::wasm::Literal::~Literal(&local_130);
      std::shared_ptr<wasm::GCData>::~shared_ptr((shared_ptr<wasm::GCData> *)local_d0);
    }
    Flow::~Flow((Flow *)&data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
  }
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitArrayGet(ArrayGet* curr) {
    NOTE_ENTER("ArrayGet");
    Flow ref = self()->visit(curr->ref);
    if (ref.breaking()) {
      return ref;
    }
    Flow index = self()->visit(curr->index);
    if (index.breaking()) {
      return index;
    }
    auto data = ref.getSingleValue().getGCData();
    if (!data) {
      trap("null ref");
    }
    Index i = index.getSingleValue().geti32();
    if (i >= data->values.size()) {
      trap("array oob");
    }
    auto field = curr->ref->type.getHeapType().getArray().element;
    return extendForPacking(data->values[i], field, curr->signed_);
  }